

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

LY_ERR lyht_find_rec(ly_ht *ht,void *val_p,uint32_t hash,ly_bool mod,lyht_value_equal_cb val_equal,
                    uint32_t *col,ly_ht_rec **rec_p)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  ly_bool lVar3;
  LY_ERR LVar4;
  ly_ht_rec *plVar5;
  
  uVar2 = ht->size;
  if (col != (uint32_t *)0x0) {
    *col = 0;
  }
  uVar2 = ht->hlists[uVar2 - 1 & hash].first;
  LVar4 = LY_ENOTFOUND;
  if (uVar2 == 0xffffffff) {
    plVar5 = (ly_ht_rec *)0x0;
  }
  else {
    plVar5 = (ly_ht_rec *)(ht->recs + uVar2 * ht->rec_size);
    do {
      if (plVar5->hash == hash) {
        lVar3 = (*val_equal)(val_p,plVar5->val,mod,ht->cb_data);
        if (lVar3 != '\0') {
          LVar4 = LY_SUCCESS;
          goto LAB_001119ce;
        }
      }
      if (col != (uint32_t *)0x0) {
        *col = *col + 1;
      }
      puVar1 = &plVar5->next;
      plVar5 = (ly_ht_rec *)(ht->recs + (uint)ht->rec_size * *puVar1);
    } while (*puVar1 != 0xffffffff);
    plVar5 = (ly_ht_rec *)0x0;
    LVar4 = LY_ENOTFOUND;
  }
LAB_001119ce:
  *rec_p = plVar5;
  return LVar4;
}

Assistant:

static LY_ERR
lyht_find_rec(const struct ly_ht *ht, void *val_p, uint32_t hash, ly_bool mod, lyht_value_equal_cb val_equal,
        uint32_t *col, struct ly_ht_rec **rec_p)
{
    uint32_t hlist_idx = hash & (ht->size - 1);
    struct ly_ht_rec *rec;
    uint32_t rec_idx;

    if (col) {
        *col = 0;
    }

    LYHT_ITER_HLIST_RECS(ht, hlist_idx, rec_idx, rec) {
        if ((rec->hash == hash) && val_equal(val_p, &rec->val, mod, ht->cb_data)) {
            *rec_p = rec;
            return LY_SUCCESS;
        }

        if (col) {
            *col = *col + 1;
        }
    }

    /* not found even in collisions */
    *rec_p = NULL;
    return LY_ENOTFOUND;
}